

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::EndTesting(BasicReporter *this,Totals *totals)

{
  Totals *pTVar1;
  ostream *this_00;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Totals *local_18;
  Totals *totals_local;
  BasicReporter *this_local;
  
  local_18 = totals;
  totals_local = (Totals *)this;
  if ((this->m_aborted & 1U) == 0) {
    std::operator<<((this->m_config).stream,"\n[Testing completed. ");
    pTVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"All ",&local_71);
    ReportCounts(this,pTVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    std::operator<<((this->m_config).stream,"\n[Testing aborted. ");
    pTVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"The first ",&local_39);
    ReportCounts(this,pTVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  this_00 = std::operator<<((this->m_config).stream,"]\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void EndTesting( const Totals& totals ) {
            // Output the overall test results even if "Started Testing" was not emitted
            if( m_aborted ) {
                m_config.stream << "\n[Testing aborted. ";
                ReportCounts( totals, "The first " );
            }
            else {
                m_config.stream << "\n[Testing completed. ";
                ReportCounts( totals );
            }
            m_config.stream << "]\n" << std::endl;
        }